

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O1

const_iterator * __thiscall
pstore::index::
hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
::find<pstore::indirect_string,void>
          (const_iterator *__return_storage_ptr__,void *this,database *db,indirect_string *key)

{
  ulong uVar1;
  span<unsigned_char,__1L> sp;
  long lVar2;
  const_iterator *pcVar3;
  bool bVar4;
  uint64_t uVar5;
  index_pointer iVar6;
  size_t __nbytes;
  uint uVar7;
  unsigned_long uVar8;
  internal_node *piVar9;
  index_pointer node;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar10;
  type uninit_buffer;
  key_type existing_key;
  parent_stack parents;
  pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
  local_178;
  parent_stack *local_160;
  const_iterator *local_158;
  database_reference local_150;
  database *local_138;
  index_pointer local_130;
  undefined1 local_128 [16];
  anon_union_8_2_d34ab9e4_for_indirect_string_3 local_118;
  index_pointer local_108 [26];
  ulong local_38;
  
  bVar4 = hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
          ::empty((hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                   *)this);
  if (bVar4) {
    memset(&__return_storage_ptr__->visited_parents_,0,0xd8);
    __return_storage_ptr__->db_ = db;
    __return_storage_ptr__->index_ =
         (hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
          *)this;
    (__return_storage_ptr__->pos_)._M_t.
    super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
    .
    super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
    ._M_head_impl = (pair<const_pstore::indirect_string,_pstore::index::details::empty_class> *)0x0;
  }
  else {
    uVar5 = fnv_64a_hash_indirect_string::operator()
                      ((fnv_64a_hash_indirect_string *)((long)this + 0x28),key);
    node = *(index_pointer *)((long)this + 0x18);
    memset(local_108,0,0xd8);
    local_160 = &__return_storage_ptr__->visited_parents_;
    uVar7 = 0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_158 = __return_storage_ptr__;
    local_150 = db;
    do {
      if (((ulong)node.internal_ & 1) == 0) {
        if (((ulong)node.internal_ & 2) != 0) {
          __assert_fail("is_address ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                        ,0xe3,"address pstore::index::details::index_pointer::to_address() const");
        }
        sp.storage_.data_ = (pointer)key;
        sp.storage_.super_extent_type<_1L>.size_ = (index_type)this;
        local_138 = db;
        local_130 = node;
        serialize::flood<_1l>(sp);
        serialize::serializer<pstore::indirect_string,_void>::read
                  ((int)&local_138,&local_178,__nbytes);
        pcVar3 = local_158;
        local_118.str_ = (raw_sstring_view *)local_178.second;
        local_128._0_8_ =
             local_178.first.
             super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        local_128._8_8_ =
             local_178.first.
             super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        bVar4 = indirect_string::operator==((indirect_string *)local_128,key);
        if (bVar4) {
          if (0xc < local_38) {
            assert_failed("elements_ < Size",
                          "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                          ,100);
          }
          local_108[local_38 * 2] = node;
          lVar2 = local_38 * 2;
          local_38 = local_38 + 1;
          local_108[lVar2 + 1] = (index_pointer)0xffffffffffffffff;
          pcVar3->db_ = db;
          memcpy(local_160,local_108,0xd8);
        }
        else {
          memset(local_160,0,0xd8);
          pcVar3->db_ = db;
        }
        pcVar3->index_ =
             (hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
              *)this;
        (pcVar3->pos_)._M_t.
        super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
        .
        super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
        ._M_head_impl =
             (pair<const_pstore::indirect_string,_pstore::index::details::empty_class> *)0x0;
        this_01._M_pi = this_00;
        break;
      }
      if (uVar7 < 0x42) {
        details::internal_node::get_node(&local_178,db,node);
        this_01._M_pi =
             local_178.first.
             super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        local_178.first.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_178.first.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        piVar9 = local_178.second;
        if (local_178.first.
            super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_178.first.
                     super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        uVar1 = piVar9->bitmap_;
        if ((uVar1 >> (uVar5 & 0x3f) & 1) == 0) {
          uVar8 = 0xffffffffffffffff;
          iVar6.internal_ = (internal_node *)0x0;
        }
        else {
          uVar8 = POPCOUNT(uVar1 & (1L << ((byte)uVar5 & 0x3f)) - 1U);
          iVar6 = (index_pointer)piVar9->children_[uVar8].internal_;
        }
        pVar10.second = uVar8;
        pVar10.first.internal_ = iVar6.internal_;
        db = local_150;
      }
      else {
        details::linear_node::get_node
                  ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                    *)&local_178,db,node);
        this_01._M_pi =
             local_178.first.
             super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        local_178.first.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_178.first.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        piVar9 = local_178.second;
        if (local_178.first.
            super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_178.first.
                     super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        db = local_150;
        pVar10 = details::linear_node::
                 lookup<pstore::indirect_string,pstore::indirect_string,std::equal_to<pstore::indirect_string>,void>
                           ((linear_node *)piVar9,local_150,key);
      }
      piVar9 = (internal_node *)pVar10.second;
      if (piVar9 == (internal_node *)0xffffffffffffffff) {
        memset(local_160,0,0xd8);
        local_158->db_ = db;
        local_158->index_ =
             (hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
              *)this;
        (local_158->pos_)._M_t.
        super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
        .
        super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
        ._M_head_impl =
             (pair<const_pstore::indirect_string,_pstore::index::details::empty_class> *)0x0;
      }
      else {
        if (0xc < local_38) {
          assert_failed("elements_ < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                        ,100);
        }
        local_108[local_38 * 2] = node;
        lVar2 = local_38 * 2;
        local_38 = local_38 + 1;
        local_108[lVar2 + 1].internal_ = piVar9;
        uVar7 = uVar7 + 6;
        uVar5 = uVar5 >> 6;
        node = pVar10.first;
      }
      this_00 = this_01._M_pi;
    } while (piVar9 != (internal_node *)0xffffffffffffffff);
    __return_storage_ptr__ = local_158;
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
      __return_storage_ptr__ = local_158;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::find (database const & db,
                                                                 OtherKeyType const & key) const
            -> const_iterator {
            if (empty ()) {
                return this->cend (db);
            }

            auto hash = static_cast<hash_type> (hash_ (key));
            unsigned bit_shifts = 0;
            index_pointer node = root_;
            parent_stack parents;

            std::shared_ptr<void const> store_node;
            while (!node.is_leaf ()) {
                index_pointer child_node;
                auto index = std::size_t{0};

                if (details::depth_is_internal_node (bit_shifts)) {
                    // It's an internal node.
                    internal_node const * internal = nullptr;
                    std::tie (store_node, internal) = internal_node::get_node (db, node);
                    std::tie (child_node, index) =
                        internal->lookup (hash & details::hash_index_mask);
                } else {
                    // It's a linear node.
                    linear_node const * linear = nullptr;
                    std::tie (store_node, linear) = linear_node::get_node (db, node);
                    std::tie (child_node, index) = linear->lookup<KeyType> (db, key, equal_);
                }

                if (index == details::not_found) {
                    return this->cend (db);
                }
                parents.push (details::parent_type{node, index});

                // Go to next sub-trie level
                node = child_node;
                bit_shifts += details::hash_index_bits;
                hash >>= details::hash_index_bits;
            }
            // It's a leaf node.
            PSTORE_ASSERT (node.is_leaf ());
            key_type const existing_key = get_key (db, node.to_address ());
            if (equal_ (existing_key, key)) {
                parents.push (details::parent_type{node});
                return const_iterator (db, std::move (parents), this);
            }
            return this->cend (db);
        }